

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError CloseStream(PaStream *s)

{
  PaUtil_TerminateBufferProcessor((PaUtilBufferProcessor *)((long)s + 0x68));
  PaUtil_TerminateStreamRepresentation((PaUtilStreamRepresentation *)s);
  PaAlsaStream_Terminate((PaAlsaStream *)s);
  return 0;
}

Assistant:

static PaError CloseStream( PaStream* s )
{
    PaError result = paNoError;
    PaAlsaStream *stream = (PaAlsaStream*)s;

    PaUtil_TerminateBufferProcessor( &stream->bufferProcessor );
    PaUtil_TerminateStreamRepresentation( &stream->streamRepresentation );

    PaAlsaStream_Terminate( stream );

    return result;
}